

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

ValidateXrFlagsResult ValidateXrOverlaySessionCreateFlagsEXTX(XrFlags64 value)

{
  XrFlags64 int_value;
  XrFlags64 value_local;
  
  if (value == 0) {
    value_local._4_4_ = VALIDATE_XR_FLAGS_ZERO;
  }
  else if (value == 0) {
    value_local._4_4_ = VALIDATE_XR_FLAGS_SUCCESS;
  }
  else {
    value_local._4_4_ = VALIDATE_XR_FLAGS_INVALID;
  }
  return value_local._4_4_;
}

Assistant:

ValidateXrFlagsResult ValidateXrOverlaySessionCreateFlagsEXTX(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}